

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_type __thiscall llvm::StringRef::find_first_of(StringRef *this,StringRef Chars,size_t From)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  size_type e;
  size_type i_1;
  size_type i;
  bitset<256UL> CharBits;
  size_t From_local;
  StringRef *this_local;
  StringRef Chars_local;
  
  Chars_local.Data = (char *)Chars.Length;
  this_local = (StringRef *)Chars.Data;
  CharBits.super__Base_bitset<4UL>._M_w[3] = From;
  std::bitset<256UL>::bitset((bitset<256UL> *)&i);
  for (i_1 = 0; sVar3 = size((StringRef *)&this_local), i_1 != sVar3; i_1 = i_1 + 1) {
    bVar1 = operator[]((StringRef *)&this_local,i_1);
    std::bitset<256UL>::set((bitset<256UL> *)&i,(ulong)bVar1,true);
  }
  puVar4 = std::min<unsigned_long>(CharBits.super__Base_bitset<4UL>._M_w + 3,&this->Length);
  e = *puVar4;
  sVar3 = this->Length;
  while( true ) {
    if (e == sVar3) {
      return 0xffffffffffffffff;
    }
    bVar2 = std::bitset<256UL>::test((bitset<256UL> *)&i,(ulong)(byte)this->Data[e]);
    if (bVar2) break;
    e = e + 1;
  }
  return e;
}

Assistant:

StringRef::size_type StringRef::find_first_of(StringRef Chars,
                                              size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0; i != Chars.size(); ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length), e = Length; i != e; ++i)
    if (CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}